

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O1

void __thiscall
HighsLp::deleteColsFromVectors
          (HighsLp *this,HighsInt *new_num_col,HighsIndexCollection *index_collection)

{
  int iVar1;
  int iVar2;
  pointer pHVar3;
  pointer pHVar4;
  pointer pdVar5;
  pointer pHVar6;
  uint uVar7;
  long lVar8;
  HighsInt keep_to_col;
  HighsInt to_k;
  HighsInt current_set_entry;
  HighsInt keep_from_col;
  HighsInt delete_to_col;
  HighsInt delete_from_col;
  HighsInt from_k;
  HighsInt local_7c;
  int local_78;
  HighsInt local_74;
  int local_70;
  int local_6c;
  HighsInt local_68;
  uint local_64;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  pointer local_50;
  pointer local_48;
  HighsIndexCollection *local_40;
  ulong local_38;
  
  limits(index_collection,(HighsInt *)&local_64,&local_78);
  *new_num_col = this->num_col_;
  if ((int)local_64 <= local_78) {
    local_7c = -1;
    local_74 = 0;
    iVar1 = this->num_col_;
    *new_num_col = 0;
    local_58 = &this->col_names_;
    local_48 = (this->col_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_50 = (this->col_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_60 = &this->integrality_;
    pHVar3 = (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pHVar4 = (this->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((int)local_64 <= local_78) {
      iVar1 = iVar1 + -1;
      uVar7 = local_64;
      local_40 = index_collection;
      while( true ) {
        updateOutInIndex(index_collection,&local_68,&local_6c,&local_70,&local_7c,&local_74);
        if (uVar7 == local_64) {
          *new_num_col = local_68;
        }
        if (iVar1 <= local_6c) break;
        local_38 = (ulong)uVar7;
        if (local_70 <= local_7c) {
          lVar8 = (long)local_70 + -1;
          do {
            pdVar5 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar2 = *new_num_col;
            pdVar5[iVar2] = pdVar5[lVar8 + 1];
            pdVar5 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5[iVar2] = pdVar5[lVar8 + 1];
            pdVar5 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5[iVar2] = pdVar5[lVar8 + 1];
            if (local_50 != local_48) {
              std::__cxx11::string::_M_assign
                        ((string *)
                         ((local_58->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + iVar2));
            }
            if (pHVar3 != pHVar4) {
              pHVar6 = (local_60->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              pHVar6[*new_num_col] = pHVar6[lVar8 + 1];
            }
            *new_num_col = *new_num_col + 1;
            lVar8 = lVar8 + 1;
            index_collection = local_40;
          } while (lVar8 < local_7c);
        }
        if ((iVar1 <= local_7c) || (uVar7 = (int)local_38 + 1, local_78 <= (int)local_38)) break;
      }
    }
    std::vector<double,_std::allocator<double>_>::resize(&this->col_cost_,(long)*new_num_col);
    std::vector<double,_std::allocator<double>_>::resize(&this->col_lower_,(long)*new_num_col);
    std::vector<double,_std::allocator<double>_>::resize(&this->col_upper_,(long)*new_num_col);
    if (pHVar3 != pHVar4) {
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize(local_60,(long)*new_num_col);
    }
    if (local_50 != local_48) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(local_58,(long)*new_num_col);
    }
  }
  return;
}

Assistant:

void HighsLp::deleteColsFromVectors(
    HighsInt& new_num_col, const HighsIndexCollection& index_collection) {
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Initialise new_num_col in case none is removed due to from_k > to_k
  new_num_col = this->num_col_;
  if (from_k > to_k) return;

  HighsInt delete_from_col;
  HighsInt delete_to_col;
  HighsInt keep_from_col;
  HighsInt keep_to_col = -1;
  HighsInt current_set_entry = 0;

  HighsInt col_dim = this->num_col_;
  new_num_col = 0;
  bool have_names = (this->col_names_.size() != 0);
  bool have_integrality = (this->integrality_.size() != 0);
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_col, delete_to_col,
                     keep_from_col, keep_to_col, current_set_entry);
    // Account for the initial columns being kept
    if (k == from_k) new_num_col = delete_from_col;
    if (delete_to_col >= col_dim - 1) break;
    assert(delete_to_col < col_dim);
    for (HighsInt col = keep_from_col; col <= keep_to_col; col++) {
      this->col_cost_[new_num_col] = this->col_cost_[col];
      this->col_lower_[new_num_col] = this->col_lower_[col];
      this->col_upper_[new_num_col] = this->col_upper_[col];
      if (have_names) this->col_names_[new_num_col] = this->col_names_[col];
      if (have_integrality)
        this->integrality_[new_num_col] = this->integrality_[col];
      new_num_col++;
    }
    if (keep_to_col >= col_dim - 1) break;
  }
  this->col_cost_.resize(new_num_col);
  this->col_lower_.resize(new_num_col);
  this->col_upper_.resize(new_num_col);
  if (have_integrality) this->integrality_.resize(new_num_col);
  if (have_names) this->col_names_.resize(new_num_col);
}